

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::pair<QString,_ProStringList>_>::relocate
          (QArrayDataPointer<std::pair<QString,_ProStringList>_> *this,qsizetype offset,
          pair<QString,_ProStringList> **data)

{
  pair<QString,_ProStringList> *d_first;
  pair<QString,_ProStringList> *ppVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<std::pair<QString,ProStringList>,long_long>
            (this->ptr,this->size,d_first);
  if (data != (pair<QString,_ProStringList> **)0x0) {
    ppVar1 = *data;
    if ((this->ptr <= ppVar1) && (ppVar1 < this->ptr + this->size)) {
      *data = ppVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }